

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void RunBenchmark<double>(TBenchmarkOpts *opts)

{
  size_type __new_size;
  size_type __n;
  size_t nIter;
  ulong vecSize;
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  size_type sVar7;
  runtime_error *this;
  double *pdVar8;
  pointer pcVar9;
  uint uVar10;
  size_t j;
  ulong uVar11;
  double *pdVar12;
  result_type_conflict rVar13;
  double dVar14;
  allocator<char> local_ae1;
  string local_ae0;
  char local_abc;
  char local_abb;
  char local_aba;
  char local_ab9;
  vector<double_*,_std::allocator<double_*>_> outVectors;
  vector<double_*,_std::allocator<double_*>_> inVectors;
  undefined4 local_a88;
  undefined4 uStack_a84;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  outData;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  inData;
  uniform_real_distribution<double> local_a28;
  string func;
  mt19937_64 rng;
  
  std::__cxx11::string::string((string *)&func,(string *)opts);
  __n = opts->NVectors;
  nIter = opts->NIter;
  vecSize = opts->VecSize;
  uVar1 = opts->Alignment;
  bVar2 = std::operator==(&func,"exp");
  bVar3 = std::operator==(&func,"log");
  bVar4 = std::operator==(&func,"sigm");
  bVar5 = std::operator==(&func,"tanh");
  local_abc = bVar3;
  local_aba = bVar4;
  local_ab9 = bVar2;
  if ((!bVar2 && !bVar3) && (!bVar4 && !bVar5)) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "requirement isExp || isLog || isSigm || isTanh failed");
    std::endl<char,std::char_traits<char>>(poVar6);
LAB_001104f7:
    exit(1);
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"Preparing data. Vector size: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"\tnumber of vectors: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"\tnumber of tries: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&rng,0xf);
  local_a28._M_param._M_a = 0.0;
  local_a28._M_param._M_b = 1.0;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(&inData,__n,(allocator_type *)&local_ae0);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(&outData,__n,(allocator_type *)&local_ae0);
  if (0x1f < uVar1) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"requirement alignment < 32 failed");
    std::endl<char,std::char_traits<char>>(poVar6);
    goto LAB_001104f7;
  }
  if ((uVar1 & 7) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "requirement on natural alignment failed: alignment should be multiple of "
                            );
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
    goto LAB_001104f7;
  }
  std::vector<double_*,_std::allocator<double_*>_>::vector
            (&inVectors,__n,(allocator_type *)&local_ae0);
  local_abb = bVar5;
  std::vector<double_*,_std::allocator<double_*>_>::vector
            (&outVectors,__n,(allocator_type *)&local_ae0);
  __new_size = vecSize * 8 + 0x20;
  for (sVar7 = 0; sVar7 != __n; sVar7 = sVar7 + 1) {
    std::vector<char,_std::allocator<char>_>::resize
              (inData.
               super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + sVar7,__new_size);
    std::vector<char,_std::allocator<char>_>::resize
              (outData.
               super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + sVar7,__new_size);
    pdVar8 = (double *)
             inData.
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar7].
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      pdVar12 = pdVar8;
      pdVar8 = (double *)((long)pdVar12 + 1);
    } while (((uint)pdVar12 & 0x1f) != uVar1);
    pcVar9 = outData.
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar7].
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar8 = (double *)(pcVar9 + -1);
    do {
      uVar10 = (uint)pcVar9;
      pdVar8 = (double *)((long)pdVar8 + 1);
      pcVar9 = pcVar9 + 1;
    } while ((uVar10 & 0x1f) != uVar1);
    inVectors.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
    super__Vector_impl_data._M_start[sVar7] = pdVar12;
    outVectors.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
    super__Vector_impl_data._M_start[sVar7] = pdVar8;
    for (uVar11 = 0; vecSize != uVar11; uVar11 = uVar11 + 1) {
      rVar13 = std::uniform_real_distribution<double>::operator()(&local_a28,&rng);
      dVar14 = rVar13 * 100.0 + -50.0;
      pdVar12[uVar11] = dVar14;
      if (local_abc == '\0') {
        if (bVar4 || bVar5) {
          dVar14 = dVar14 / 10.0;
          goto LAB_0010fc0e;
        }
      }
      else {
        dVar14 = exp(dVar14);
LAB_0010fc0e:
        pdVar12[uVar11] = dVar14;
      }
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"Running");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_a88 = (undefined4)nIter;
  uStack_a84 = (undefined4)(nIter >> 0x20);
  if (local_ab9 == '\0') {
    if (local_abc == '\0') {
      if (local_aba == '\0') {
        if (local_abb == '\0') {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"!(isExp || isLog || isSigm || isTanh)");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"slow tanh",&local_ae1);
        BenchmarkFunc<TSlowTanh,double>(&inVectors,&outVectors,vecSize,1,&local_ae0);
        std::__cxx11::string::~string((string *)&local_ae0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"plain fast tanh",&local_ae1);
        dVar14 = round((((double)CONCAT44(0x45300000,uStack_a84) - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,local_a88) - 4503599627370496.0)) * 0.5);
        BenchmarkFunc<TPlainTanh,double>
                  (&inVectors,&outVectors,vecSize,(long)(int)dVar14,&local_ae0);
        std::__cxx11::string::~string((string *)&local_ae0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"avx fast tanh",&local_ae1);
        BenchmarkFunc<TAvxTanh<false>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
        std::__cxx11::string::~string((string *)&local_ae0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"avx fast exact tanh",&local_ae1);
        BenchmarkFunc<TAvxTanh<true>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
        std::__cxx11::string::~string((string *)&local_ae0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"dispatched fast sigmoid",&local_ae1);
        BenchmarkFunc<TDispatchedAvx2Tanh<false>,double>
                  (&inVectors,&outVectors,vecSize,nIter,&local_ae0);
        std::__cxx11::string::~string((string *)&local_ae0);
        bVar2 = NFastOps::HaveAvx2();
        if (!bVar2) goto LAB_0011044a;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"avx2 fast tanh",&local_ae1);
        BenchmarkFunc<TAvx2Tanh<false>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
        std::__cxx11::string::~string((string *)&local_ae0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"avx2 fast exact tanh",&local_ae1);
        BenchmarkFunc<TAvx2Tanh<true>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"slow sigmoid",&local_ae1);
        BenchmarkFunc<TSlowSigm,double>(&inVectors,&outVectors,vecSize,1,&local_ae0);
        std::__cxx11::string::~string((string *)&local_ae0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"plain fast sigmoid",&local_ae1);
        dVar14 = round((((double)CONCAT44(0x45300000,uStack_a84) - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,local_a88) - 4503599627370496.0)) * 0.5);
        BenchmarkFunc<TPlainSigm,double>
                  (&inVectors,&outVectors,vecSize,(long)(int)dVar14,&local_ae0);
        std::__cxx11::string::~string((string *)&local_ae0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"avx fast sigmoid",&local_ae1);
        BenchmarkFunc<TAvxSigm<false>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
        std::__cxx11::string::~string((string *)&local_ae0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"avx fast exact sigmoid",&local_ae1);
        BenchmarkFunc<TAvxSigm<true>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
        std::__cxx11::string::~string((string *)&local_ae0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"dispatched fast sigmoid",&local_ae1);
        BenchmarkFunc<TDispatchedAvx2Sigm<false>,double>
                  (&inVectors,&outVectors,vecSize,nIter,&local_ae0);
        std::__cxx11::string::~string((string *)&local_ae0);
        bVar2 = NFastOps::HaveAvx2();
        if (!bVar2) goto LAB_0011044a;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"avx2 fast sigmoid",&local_ae1);
        BenchmarkFunc<TAvx2Sigm<false>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
        std::__cxx11::string::~string((string *)&local_ae0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"avx2 fast exact sigmoid",&local_ae1);
        BenchmarkFunc<TAvx2Sigm<true>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae0,"slow log",&local_ae1)
      ;
      BenchmarkFunc<TSlowLog,double>(&inVectors,&outVectors,vecSize,1,&local_ae0);
      std::__cxx11::string::~string((string *)&local_ae0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ae0,"plain fast log",&local_ae1);
      dVar14 = round((((double)CONCAT44(0x45300000,uStack_a84) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,local_a88) - 4503599627370496.0)) * 0.5);
      BenchmarkFunc<TPlainLog,double>(&inVectors,&outVectors,vecSize,(long)(int)dVar14,&local_ae0);
      std::__cxx11::string::~string((string *)&local_ae0);
      if ((vecSize & 3) == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae0,"fmath log",&local_ae1);
        BenchmarkFunc<TFmathLog,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
        std::__cxx11::string::~string((string *)&local_ae0);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ae0,"avx fast log",&local_ae1);
      BenchmarkFunc<TAvxLog<false>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
      std::__cxx11::string::~string((string *)&local_ae0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ae0,"dispatched fast log",&local_ae1);
      BenchmarkFunc<TDispatchedAvx2Log<false>,double>
                (&inVectors,&outVectors,vecSize,nIter,&local_ae0);
      std::__cxx11::string::~string((string *)&local_ae0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ae0,"avx fast exact log",&local_ae1);
      BenchmarkFunc<TAvxLog<true>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
      std::__cxx11::string::~string((string *)&local_ae0);
      bVar2 = NFastOps::HaveAvx2();
      if (!bVar2) goto LAB_0011044a;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ae0,"avx2 fast log",&local_ae1);
      BenchmarkFunc<TAvx2Log<false>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
      std::__cxx11::string::~string((string *)&local_ae0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ae0,"avx2 fast exact log",&local_ae1);
      BenchmarkFunc<TAvx2Log<true>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae0,"slow exp",&local_ae1);
    BenchmarkFunc<TSlowExp,double>(&inVectors,&outVectors,vecSize,1,&local_ae0);
    std::__cxx11::string::~string((string *)&local_ae0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ae0,"plain fast exp",&local_ae1);
    dVar14 = round((((double)CONCAT44(0x45300000,uStack_a84) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,local_a88) - 4503599627370496.0)) * 0.5);
    BenchmarkFunc<TPlainExp,double>(&inVectors,&outVectors,vecSize,(long)(int)dVar14,&local_ae0);
    std::__cxx11::string::~string((string *)&local_ae0);
    if ((uVar1 & 8) == 0 && (vecSize & 3) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ae0,"fmath exp",&local_ae1);
      BenchmarkFunc<TFmathExp,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
      std::__cxx11::string::~string((string *)&local_ae0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ae0,"avx fast exp",&local_ae1);
    BenchmarkFunc<TAvxExp<false>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
    std::__cxx11::string::~string((string *)&local_ae0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ae0,"avx fast exact exp",&local_ae1);
    BenchmarkFunc<TAvxExp<true>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
    std::__cxx11::string::~string((string *)&local_ae0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ae0,"dispatched fast exp",&local_ae1);
    BenchmarkFunc<TDispatchedAvx2Exp<false>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0)
    ;
    std::__cxx11::string::~string((string *)&local_ae0);
    bVar2 = NFastOps::HaveAvx2();
    if (!bVar2) goto LAB_0011044a;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ae0,"avx2 fast exp",&local_ae1);
    BenchmarkFunc<TAvx2Exp<false>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
    std::__cxx11::string::~string((string *)&local_ae0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ae0,"avx2 fast exact exp",&local_ae1);
    BenchmarkFunc<TAvx2Exp<true>,double>(&inVectors,&outVectors,vecSize,nIter,&local_ae0);
  }
  std::__cxx11::string::~string((string *)&local_ae0);
LAB_0011044a:
  std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base
            (&outVectors.super__Vector_base<double_*,_std::allocator<double_*>_>);
  std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base
            (&inVectors.super__Vector_base<double_*,_std::allocator<double_*>_>);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&outData);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&inData);
  std::__cxx11::string::~string((string *)&func);
  return;
}

Assistant:

void RunBenchmark(const TBenchmarkOpts& opts) {
    std::string func = opts.Func;
    size_t nVectors = opts.NVectors;
    size_t nIter = opts.NIter;
    size_t vecSize = opts.VecSize;
    size_t alignment = opts.Alignment;

    bool isExp = func == "exp";
    bool isLog = func == "log";
    bool isSigm = func == "sigm";
    bool isTanh = func == "tanh";
    if (!(isExp || isLog || isSigm || isTanh)) {
        std::cerr << "requirement isExp || isLog || isSigm || isTanh failed" << std::endl;
        exit(1);
    }

    std::cerr << "Preparing data. Vector size: " << vecSize << "\tnumber of vectors: " << nVectors << "\tnumber of tries: " << nIter << std::endl;
    std::mt19937_64 rng(15);
    std::uniform_real_distribution<> dis(0, 1.0);
    std::vector<std::vector<char>> inData(nVectors);
    std::vector<std::vector<char>> outData(nVectors);

    if (alignment >= 32) {
        std::cerr << "requirement alignment < 32 failed" << std::endl;
        exit(1);
    }
    if (alignment % sizeof(T) != 0) {
        std::cerr << "requirement on natural alignment failed: alignment should be multiple of " << sizeof(T) << std::endl;
        exit(1);
    }

    std::vector<T*> inVectors(nVectors);
    std::vector<T*> outVectors(nVectors);
    for (size_t i = 0; i < nVectors; ++i) {
        inData[i].resize(vecSize * sizeof(T) + 32);
        outData[i].resize(vecSize * sizeof(T) + 32);
        char* inV = inData[i].data();
        size_t cnt = 0;
        while ((size_t)inV % 32 != alignment) {
            ++inV;
        }
        cnt = 0;
        char* outV = outData[i].data();
        while ((size_t)outV % 32 != alignment) {
            ++outV;
        }

        inVectors[i] = (T*)inV;
        outVectors[i] = (T*)outV;
        for (size_t j = 0; j < vecSize; ++j) {
            auto& val = ((T*)inV)[j];
            val = 100 * dis(rng) - 50;
            if (isLog) {
                val = exp(val);
            } else if (isTanh || isSigm) {
                val /= 10;
            }
        }
    }

    std::cerr << "Running" << std::endl;
    if (isExp) {
        // too slow, just one iteration
        BenchmarkFunc<TSlowExp>(inVectors, outVectors, vecSize, 1, "slow exp");

        // slow, half iterations
        BenchmarkFunc<TPlainExp>(inVectors, outVectors, vecSize, int(round(nIter / 2.0)), "plain fast exp");

        if (vecSize % 4 == 0 && (alignment == 0 || alignment == 16)) {
            BenchmarkFunc<TFmathExp>(inVectors, outVectors, vecSize, nIter, "fmath exp");
        }
        BenchmarkFunc<TAvxExp<false>>(inVectors, outVectors, vecSize, nIter, "avx fast exp");
        BenchmarkFunc<TAvxExp<true>>(inVectors, outVectors, vecSize, nIter, "avx fast exact exp");
        BenchmarkFunc<TDispatchedAvx2Exp<false>>(
            inVectors, outVectors, vecSize, nIter, "dispatched fast exp");
        if (NFastOps::HaveAvx2()) {
            BenchmarkFunc<TAvx2Exp<false>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exp");
            BenchmarkFunc<TAvx2Exp<true>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exact exp");
        }
    } else if (isLog) {
        // too slow, just one iteration
        BenchmarkFunc<TSlowLog>(inVectors, outVectors, vecSize, 1, "slow log");

        // slow, half iterations
        BenchmarkFunc<TPlainLog>(inVectors, outVectors, vecSize, int(round(nIter / 2.0)), "plain fast log");

        if (vecSize % 4 == 0) {
            BenchmarkFunc<TFmathLog>(inVectors, outVectors, vecSize, nIter, "fmath log");
        }
        BenchmarkFunc<TAvxLog<false>>(inVectors, outVectors, vecSize, nIter, "avx fast log");
        BenchmarkFunc<TDispatchedAvx2Log<false>>(
            inVectors, outVectors, vecSize, nIter, "dispatched fast log");
        BenchmarkFunc<TAvxLog<true>>(inVectors, outVectors, vecSize, nIter, "avx fast exact log");
        if (NFastOps::HaveAvx2()) {
            BenchmarkFunc<TAvx2Log<false>>(inVectors, outVectors, vecSize, nIter, "avx2 fast log");
            BenchmarkFunc<TAvx2Log<true>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exact log");
        }
    } else if (isSigm) {
        // too slow, just one iteration
        BenchmarkFunc<TSlowSigm>(inVectors, outVectors, vecSize, 1, "slow sigmoid");

        // slow, half iterations
        BenchmarkFunc<TPlainSigm>(inVectors, outVectors, vecSize, int(round(nIter / 2.0)), "plain fast sigmoid");

        BenchmarkFunc<TAvxSigm<false>>(inVectors, outVectors, vecSize, nIter, "avx fast sigmoid");
        BenchmarkFunc<TAvxSigm<true>>(inVectors, outVectors, vecSize, nIter, "avx fast exact sigmoid");
        BenchmarkFunc<TDispatchedAvx2Sigm<false>>(
            inVectors, outVectors, vecSize, nIter, "dispatched fast sigmoid");
        if (NFastOps::HaveAvx2()) {
            BenchmarkFunc<TAvx2Sigm<false>>(inVectors, outVectors, vecSize, nIter, "avx2 fast sigmoid");
            BenchmarkFunc<TAvx2Sigm<true>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exact sigmoid");
        }
    } else if (isTanh) {
        // too slow, just one iteration
        BenchmarkFunc<TSlowTanh>(inVectors, outVectors, vecSize, 1, "slow tanh");

        // slow, half iterations
        BenchmarkFunc<TPlainTanh>(inVectors, outVectors, vecSize, int(round(nIter / 2.0)), "plain fast tanh");

        BenchmarkFunc<TAvxTanh<false>>(inVectors, outVectors, vecSize, nIter, "avx fast tanh");
        BenchmarkFunc<TAvxTanh<true>>(inVectors, outVectors, vecSize, nIter, "avx fast exact tanh");
        BenchmarkFunc<TDispatchedAvx2Tanh<false>>(
            inVectors, outVectors, vecSize, nIter, "dispatched fast sigmoid");
        if (NFastOps::HaveAvx2()) {
            BenchmarkFunc<TAvx2Tanh<false>>(inVectors, outVectors, vecSize, nIter, "avx2 fast tanh");
            BenchmarkFunc<TAvx2Tanh<true>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exact tanh");
        }
    } else {
        throw std::runtime_error("!(isExp || isLog || isSigm || isTanh)");
    }
}